

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.h
# Opt level: O2

error_code_t *
base64::encode_impl<base64::def_encoding_t>
          (error_code_t *__return_storage_ptr__,const_adapter_t *raw_data,
          mutable_adapter_t *base64_data)

{
  byte bVar1;
  ulong uVar2;
  uchar *puVar3;
  uchar *puVar4;
  long lVar5;
  uint8_t uVar6;
  ulong uVar7;
  ulong required_size;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  uint8_t *puVar11;
  
  uVar2 = raw_data->m_size;
  required_size = ((uVar2 + 2) / 3) * 4;
  if (base64_data->m_size < required_size) {
    detail::insufficient_buffer_size_error(__return_storage_ptr__,base64_data->m_size,required_size)
    ;
    return __return_storage_ptr__;
  }
  puVar3 = raw_data->m_data;
  puVar4 = base64_data->m_data;
  puVar11 = puVar4 + 3;
  uVar7 = 0;
  while (uVar7 < uVar2) {
    uVar8 = uVar7 + 1;
    uVar9 = 0;
    uVar10 = 0;
    if (uVar8 < uVar2) {
      uVar8 = uVar7 + 2;
      uVar10 = (uint)puVar3[uVar7 + 1] << 8;
    }
    if (uVar8 < uVar2) {
      uVar9 = (uint)puVar3[uVar8];
      uVar8 = uVar8 + 1;
    }
    bVar1 = puVar3[uVar7];
    uVar6 = def_encoding_t::char_at((ulong)(((uint)bVar1 << 0x10) >> 0x12));
    puVar11[-3] = uVar6;
    uVar6 = def_encoding_t::char_at((ulong)((uVar10 | (uint)bVar1 << 0x10) >> 0xc & 0x3f));
    puVar11[-2] = uVar6;
    uVar6 = def_encoding_t::char_at((ulong)((uVar9 | uVar10) >> 6 & 0x3f));
    puVar11[-1] = uVar6;
    uVar6 = def_encoding_t::char_at((ulong)(uVar9 & 0x3f));
    *puVar11 = uVar6;
    puVar11 = puVar11 + 4;
    uVar7 = uVar8;
  }
  if (uVar2 % 3 == 1) {
    lVar5 = required_size - 2;
    puVar4[required_size - 1] = '=';
  }
  else {
    if (uVar2 % 3 != 2) goto LAB_0011e22a;
    lVar5 = required_size - 1;
  }
  puVar4[lVar5] = '=';
LAB_0011e22a:
  (__return_storage_ptr__->m_msg).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->m_msg).field_2 + 8) = 0;
  *(undefined8 *)&__return_storage_ptr__->m_code = 0;
  (__return_storage_ptr__->m_msg)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_msg).field_2;
  (__return_storage_ptr__->m_msg)._M_string_length = 0;
  __return_storage_ptr__->m_code = no_error;
  return __return_storage_ptr__;
}

Assistant:

error_code_t encode_impl(
        const const_adapter_t       & raw_data,
        const mutable_adapter_t     & base64_data)
    {
        const size_t raw_size = raw_data.size();
        const size_t encoded_size = calc_encoded_size_impl<encoding_traits>(raw_size);
        const size_t base64_size = base64_data.size();

        if (base64_size < encoded_size)
        {
            return detail::insufficient_buffer_size_error(base64_size, encoded_size);
        }

        const uint8_t * raw_ptr = raw_data.data();
        uint8_t * base64_ptr = base64_data.data();

        for (size_t i = 0, j = 0; i < raw_size;)
        {
            uint32_t octet_a = i < raw_size ? raw_ptr[i++] : uint8_t{ 0 };
            uint32_t octet_b = i < raw_size ? raw_ptr[i++] : uint8_t{ 0 };
            uint32_t octet_c = i < raw_size ? raw_ptr[i++] : uint8_t{ 0 };

            uint32_t triple = (octet_a << 0x10) + (octet_b << 0x08) + octet_c;

            base64_ptr[j++] = encoding_traits::char_at((triple >> 3 * 6) & 0x3F);
            base64_ptr[j++] = encoding_traits::char_at((triple >> 2 * 6) & 0x3F);
            base64_ptr[j++] = encoding_traits::char_at((triple >> 1 * 6) & 0x3F);
            base64_ptr[j++] = encoding_traits::char_at((triple >> 0 * 6) & 0x3F);
        }

        if constexpr (encoding_traits::has_pad())
        {
            const size_t tail_size = raw_size % 3;

            if (tail_size == 2)
            {
                base64_ptr[encoded_size - 1] = encoding_traits::pad();
            }
            else if (tail_size == 1)
            {
                base64_ptr[encoded_size - 1] = encoding_traits::pad();
                base64_ptr[encoded_size - 2] = encoding_traits::pad();
            }
        }

        return error_code_t{};
    }